

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

void __thiscall capnp::compiler::Compiler::Node::Node(Node *this,Node *parent,Reader *declaration)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  Impl *pIVar3;
  void *pvVar4;
  CapTableReader *pCVar5;
  WirePointer *pWVar6;
  StructDataBitCount SVar7;
  StructPointerCount SVar8;
  undefined2 uVar9;
  undefined4 uVar10;
  Which WVar11;
  uint32_t uVar12;
  uint64_t uVar13;
  int iVar14;
  size_t in_R8;
  bool bVar15;
  StringPtr SVar16;
  Reader RVar17;
  ArrayPtr<const_char> AVar18;
  Reader name;
  ListReader local_88;
  PointerReader local_58;
  
  (this->super_Resolver)._vptr_Resolver = (_func_int **)&PTR_resolve_006d5618;
  this->module = parent->module;
  (this->parent).ptr = parent;
  pCVar5 = (declaration->_reader).capTable;
  pvVar4 = (declaration->_reader).data;
  pWVar6 = (declaration->_reader).pointers;
  SVar7 = (declaration->_reader).dataSize;
  SVar8 = (declaration->_reader).pointerCount;
  uVar9 = *(undefined2 *)&(declaration->_reader).field_0x26;
  iVar14 = (declaration->_reader).nestingLimit;
  uVar10 = *(undefined4 *)&(declaration->_reader).field_0x2c;
  (this->declaration)._reader.segment = (declaration->_reader).segment;
  (this->declaration)._reader.capTable = pCVar5;
  (this->declaration)._reader.data = pvVar4;
  (this->declaration)._reader.pointers = pWVar6;
  (this->declaration)._reader.dataSize = SVar7;
  (this->declaration)._reader.pointerCount = SVar8;
  *(undefined2 *)&(this->declaration)._reader.field_0x26 = uVar9;
  (this->declaration)._reader.nestingLimit = iVar14;
  *(undefined4 *)&(this->declaration)._reader.field_0x2c = uVar10;
  bVar15 = (declaration->_reader).pointerCount == 0;
  local_58.pointer = (declaration->_reader).pointers;
  if (bVar15) {
    local_58.pointer = (WirePointer *)0x0;
  }
  local_58.nestingLimit = (declaration->_reader).nestingLimit;
  if (bVar15) {
    local_58.nestingLimit = 0x7fffffff;
  }
  local_58.segment._0_4_ = 0;
  local_58.segment._4_4_ = 0;
  local_58.capTable._0_4_ = 0;
  local_58.capTable._4_4_ = 0;
  if (!bVar15) {
    local_58.segment._0_4_ = *(undefined4 *)&(declaration->_reader).segment;
    local_58.segment._4_4_ = *(undefined4 *)((long)&(declaration->_reader).segment + 4);
    local_58.capTable._0_4_ = *(undefined4 *)&(declaration->_reader).capTable;
    local_58.capTable._4_4_ = *(undefined4 *)((long)&(declaration->_reader).capTable + 4);
  }
  uVar13 = parent->id;
  capnp::_::PointerReader::getStruct((StructReader *)&local_88,&local_58,(word *)0x0);
  local_58.pointer = (WirePointer *)0x0;
  local_58.nestingLimit = 0x7fffffff;
  if (local_88.structPointerCount != 0) {
    local_58.pointer = (WirePointer *)CONCAT44(local_88.step,local_88.elementCount);
    local_58.nestingLimit = local_88.nestingLimit;
  }
  local_58.segment._0_4_ = 0;
  local_58.segment._4_4_ = 0;
  local_58.capTable._0_4_ = 0;
  local_58.capTable._4_4_ = 0;
  if (local_88.structPointerCount != 0) {
    local_58.segment._0_4_ = local_88.segment._0_4_;
    local_58.segment._4_4_ = local_88.segment._4_4_;
    local_58.capTable._0_4_ = local_88.capTable._0_4_;
    local_58.capTable._4_4_ = local_88.capTable._4_4_;
  }
  SVar16.content =
       (ArrayPtr<const_char>)capnp::_::PointerReader::getBlob<capnp::Text>(&local_58,(void *)0x0,0);
  uVar13 = generateId(uVar13,SVar16,(Reader)declaration->_reader);
  this->id = uVar13;
  pIVar3 = parent->module->compiler;
  bVar15 = (declaration->_reader).pointerCount != 0;
  local_58.pointer = (WirePointer *)0x0;
  local_58.nestingLimit = 0x7fffffff;
  if (bVar15) {
    local_58.pointer = (declaration->_reader).pointers;
    local_58.nestingLimit = (declaration->_reader).nestingLimit;
  }
  local_58.segment._0_4_ = 0;
  local_58.segment._4_4_ = 0;
  local_58.capTable._0_4_ = 0;
  local_58.capTable._4_4_ = 0;
  if (bVar15) {
    local_58.segment._0_4_ = *(undefined4 *)&(declaration->_reader).segment;
    local_58.segment._4_4_ = *(undefined4 *)((long)&(declaration->_reader).segment + 4);
    local_58.capTable._0_4_ = *(undefined4 *)&(declaration->_reader).capTable;
    local_58.capTable._4_4_ = *(undefined4 *)((long)&(declaration->_reader).capTable + 4);
  }
  capnp::_::PointerReader::getStruct((StructReader *)&local_88,&local_58,(word *)0x0);
  local_58.pointer = (WirePointer *)0x0;
  local_58.nestingLimit = 0x7fffffff;
  if (local_88.structPointerCount != 0) {
    local_58.pointer = (WirePointer *)CONCAT44(local_88.step,local_88.elementCount);
    local_58.nestingLimit = local_88.nestingLimit;
  }
  local_58.segment._0_4_ = 0;
  local_58.segment._4_4_ = 0;
  local_58.capTable._0_4_ = 0;
  local_58.capTable._4_4_ = 0;
  if (local_88.structPointerCount != 0) {
    local_58.segment._0_4_ = local_88.segment._0_4_;
    local_58.segment._4_4_ = local_88.segment._4_4_;
    local_58.capTable._0_4_ = local_88.capTable._0_4_;
    local_58.capTable._4_4_ = local_88.capTable._4_4_;
  }
  RVar17 = capnp::_::PointerReader::getBlob<capnp::Text>(&local_58,(void *)0x0,0);
  SVar16.content.size_ = in_R8;
  SVar16.content.ptr = RVar17.super_StringPtr.content.size_;
  AVar18 = (ArrayPtr<const_char>)
           joinDisplayName((Node *)&pIVar3->nodeArena,(Arena *)parent,
                           RVar17.super_StringPtr.content.ptr,SVar16);
  (this->displayName).content = AVar18;
  WVar11 = FILE;
  if (0x1f < (declaration->_reader).dataSize) {
    WVar11 = *(Which *)((long)(declaration->_reader).data + 2);
  }
  this->kind = WVar11;
  bVar15 = (declaration->_reader).pointerCount < 8;
  local_58.pointer = (declaration->_reader).pointers + 7;
  if (bVar15) {
    local_58.pointer = (WirePointer *)0x0;
  }
  iVar14 = 0x7fffffff;
  local_58.nestingLimit = (declaration->_reader).nestingLimit;
  if (bVar15) {
    local_58.nestingLimit = 0x7fffffff;
    local_58.segment._0_4_ = 0;
    local_58.segment._4_4_ = 0;
    local_58.capTable._0_4_ = 0;
    local_58.capTable._4_4_ = 0;
  }
  else {
    local_58.segment._0_4_ = *(undefined4 *)&(declaration->_reader).segment;
    local_58.segment._4_4_ = *(undefined4 *)((long)&(declaration->_reader).segment + 4);
    local_58.capTable._0_4_ = *(undefined4 *)&(declaration->_reader).capTable;
    local_58.capTable._4_4_ = *(undefined4 *)((long)&(declaration->_reader).capTable + 4);
  }
  capnp::_::PointerReader::getList(&local_88,&local_58,INLINE_COMPOSITE,(word *)0x0);
  this->genericParamCount = local_88.elementCount;
  this->isBuiltin = false;
  (this->guardedContent).state = STUB;
  p_Var1 = &(this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  local_58.segment._0_4_ = 0;
  local_58.segment._4_4_ = 0;
  local_58.capTable._0_4_ = 0;
  local_58.capTable._4_4_ = 0;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->guardedContent).orderedNestedNodes.builder.ptr = (Node **)0x0;
  (this->guardedContent).orderedNestedNodes.builder.pos =
       (RemoveConst<capnp::compiler::Compiler::Node_*> *)0x0;
  (this->guardedContent).orderedNestedNodes.builder.endPtr = (Node **)0x0;
  (this->guardedContent).orderedNestedNodes.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  p_Var1 = &(this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->guardedContent).bootstrapSchema.ptr.isSet = false;
  (this->guardedContent).finalSchema.ptr.isSet = false;
  (this->loadedFinalSchema).ptr.isSet = false;
  (this->guardedContent).auxSchemas.ptr = (Reader *)0x0;
  (this->guardedContent).auxSchemas.size_ = 0;
  (this->guardedContent).auxSchemas.disposer = (ArrayDisposer *)0x0;
  (this->guardedContent).sourceInfo.ptr = (Reader *)0x0;
  (this->guardedContent).sourceInfo.size_ = 0;
  (this->guardedContent).sourceInfo.disposer = (ArrayDisposer *)0x0;
  this->inGetContent = false;
  local_58.pointer = (WirePointer *)0x0;
  if ((declaration->_reader).pointerCount != 0) {
    local_58.pointer = (declaration->_reader).pointers;
    iVar14 = (declaration->_reader).nestingLimit;
    local_58.segment._0_4_ = *(undefined4 *)&(declaration->_reader).segment;
    local_58.segment._4_4_ = *(undefined4 *)((long)&(declaration->_reader).segment + 4);
    local_58.capTable._0_4_ = *(undefined4 *)&(declaration->_reader).capTable;
    local_58.capTable._4_4_ = *(undefined4 *)((long)&(declaration->_reader).capTable + 4);
  }
  local_58.nestingLimit = iVar14;
  capnp::_::PointerReader::getStruct((StructReader *)&local_88,&local_58,(word *)0x0);
  bVar15 = local_88.structPointerCount == 0;
  local_58.pointer = (WirePointer *)CONCAT44(local_88.step,local_88.elementCount);
  if (bVar15) {
    local_58.pointer = (WirePointer *)0x0;
  }
  local_58.nestingLimit = 0x7fffffff;
  if (!bVar15) {
    local_58.nestingLimit = local_88.nestingLimit;
  }
  local_58.segment._0_4_ = 0;
  local_58.segment._4_4_ = 0;
  local_58.capTable._0_4_ = 0;
  local_58.capTable._4_4_ = 0;
  if (!bVar15) {
    local_58.segment._0_4_ = local_88.segment._0_4_;
    local_58.segment._4_4_ = local_88.segment._4_4_;
    local_58.capTable._0_4_ = local_88.capTable._0_4_;
    local_58.capTable._4_4_ = local_88.capTable._4_4_;
  }
  RVar17 = capnp::_::PointerReader::getBlob<capnp::Text>(&local_58,(void *)0x0,0);
  if (RVar17.super_StringPtr.content.size_ == 1) {
    uVar2 = (declaration->_reader).dataSize;
    if (uVar2 < 0x40) {
LAB_003d40db:
      this->startByte = 0;
    }
    else {
      pvVar4 = (declaration->_reader).data;
      this->startByte = *(uint32_t *)((long)pvVar4 + 4);
      if (0x5f < uVar2) {
        uVar12 = *(uint32_t *)((long)pvVar4 + 8);
        goto LAB_003d40e4;
      }
    }
  }
  else {
    if (local_88.structDataSize < 0x20) goto LAB_003d40db;
    this->startByte = *(uint32_t *)local_88.ptr;
    if (0x3f < local_88.structDataSize) {
      uVar12 = *(uint32_t *)((long)local_88.ptr + 4);
      goto LAB_003d40e4;
    }
  }
  uVar12 = 0;
LAB_003d40e4:
  this->endByte = uVar12;
  uVar13 = Impl::addNode(this->module->compiler,this->id,this);
  this->id = uVar13;
  return;
}

Assistant:

Compiler::Node::Node(Node& parent, const Declaration::Reader& declaration)
    : module(parent.module),
      parent(parent),
      declaration(declaration),
      id(generateId(parent.id, declaration.getName().getValue(), declaration.getId())),
      displayName(joinDisplayName(parent.module->getCompiler().getNodeArena(),
                                  parent, declaration.getName().getValue())),
      kind(declaration.which()),
      genericParamCount(declaration.getParameters().size()),
      isBuiltin(false) {
  auto name = declaration.getName();
  if (name.getValue().size() > 0) {
    startByte = name.getStartByte();
    endByte = name.getEndByte();
  } else {
    startByte = declaration.getStartByte();
    endByte = declaration.getEndByte();
  }

  id = module->getCompiler().addNode(id, *this);
}